

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O2

c_int init_linsys_solver_qdldl
                (qdldl_solver **sp,csc *P,csc *A,c_float sigma,c_float *rho_vec,c_int polish)

{
  size_t __size;
  size_t __size_00;
  csc *pcVar1;
  qdldl_solver *p;
  csc *pcVar2;
  c_float *pcVar3;
  QDLDL_float *pQVar4;
  c_int *pcVar5;
  QDLDL_int *pQVar6;
  QDLDL_bool *pQVar7;
  long lVar8;
  c_int *pcVar9;
  c_int *pcVar10;
  QDLDL_int QVar11;
  c_int Anz;
  c_int Pnz;
  c_int m;
  long lVar12;
  char *__format;
  csc *KKT_temp;
  csc *local_70;
  csc *local_68;
  c_float local_60;
  qdldl_solver **local_58;
  c_int local_50;
  c_float *local_48;
  size_t local_40;
  long local_38;
  
  local_60 = sigma;
  local_50 = polish;
  local_48 = rho_vec;
  p = (qdldl_solver *)calloc(1,0xe0);
  *sp = p;
  local_38 = P->n;
  p->n = local_38;
  lVar12 = A->m;
  p->m = lVar12;
  __size = lVar12 + local_38;
  p->sigma = local_60;
  p->polish = polish;
  p->solve = solve_linsys_qdldl;
  p->free = free_linsys_solver_qdldl;
  p->update_matrices = update_linsys_solver_matrices_qdldl;
  p->update_rho_vec = update_linsys_solver_rho_vec_qdldl;
  p->nthreads = 1;
  local_70 = A;
  local_68 = P;
  local_58 = sp;
  pcVar2 = (csc *)malloc(0x38);
  p->L = pcVar2;
  pcVar2->m = __size;
  pcVar2->n = __size;
  pcVar2->nz = -1;
  __size_00 = __size * 8;
  pcVar3 = (c_float *)malloc(__size_00);
  p->Dinv = pcVar3;
  pQVar4 = (QDLDL_float *)malloc(__size_00);
  p->D = pQVar4;
  pcVar5 = (c_int *)malloc(__size_00);
  p->P = pcVar5;
  pcVar3 = (c_float *)malloc(__size_00);
  p->bp = pcVar3;
  pcVar3 = (c_float *)malloc(__size_00);
  p->sol = pcVar3;
  local_40 = lVar12 * 8;
  pcVar3 = (c_float *)malloc(local_40);
  p->rho_inv_vec = pcVar3;
  pQVar6 = (QDLDL_int *)malloc(__size_00);
  p->etree = pQVar6;
  pQVar6 = (QDLDL_int *)malloc(__size_00);
  p->Lnz = pQVar6;
  pcVar5 = (c_int *)malloc(__size * 8 + 8);
  pcVar2->p = pcVar5;
  pQVar6 = (QDLDL_int *)malloc(__size * 0x18);
  pcVar2->i = (c_int *)0x0;
  pcVar2->x = (c_float *)0x0;
  p->iwork = pQVar6;
  pQVar7 = (QDLDL_bool *)malloc(__size);
  p->bwork = pQVar7;
  pQVar4 = (QDLDL_float *)malloc(__size_00);
  pcVar2 = local_68;
  p->fwork = pQVar4;
  if (local_50 == 0) {
    pcVar5 = (c_int *)malloc(local_68->p[local_38] << 3);
    p->PtoKKT = pcVar5;
    pcVar9 = (c_int *)malloc(local_70->p[local_70->n] << 3);
    p->AtoKKT = pcVar9;
    pcVar10 = (c_int *)malloc(local_40);
    pcVar2 = local_68;
    pcVar1 = local_70;
    p->rhotoKKT = pcVar10;
    lVar8 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar8;
    }
    for (; lVar12 != lVar8; lVar8 = lVar8 + 1) {
      pcVar3[lVar8] = 1.0 / local_48[lVar8];
    }
    KKT_temp = form_KKT(local_68,local_70,0,local_60,pcVar3,pcVar5,pcVar9,&p->Pdiag_idx,&p->Pdiag_n,
                        pcVar10);
    if (KKT_temp == (csc *)0x0) goto LAB_0010d91b;
    Pnz = pcVar2->p[pcVar2->n];
    m = pcVar1->m;
    Anz = pcVar1->p[pcVar1->n];
    pcVar5 = p->PtoKKT;
    pcVar9 = p->AtoKKT;
    pcVar10 = p->rhotoKKT;
  }
  else {
    lVar8 = 0;
    if (lVar12 < 1) {
      lVar12 = lVar8;
    }
    for (; lVar12 != lVar8; lVar8 = lVar8 + 1) {
      pcVar3[lVar8] = local_60;
    }
    KKT_temp = form_KKT(local_68,local_70,0,local_60,pcVar3,(c_int *)0x0,(c_int *)0x0,(c_int **)0x0,
                        (c_int *)0x0,(c_int *)0x0);
    if (KKT_temp == (csc *)0x0) goto LAB_0010d91b;
    pcVar9 = (c_int *)0x0;
    pcVar10 = (c_int *)0x0;
    Pnz = 0;
    Anz = 0;
    m = 0;
    pcVar5 = (c_int *)0x0;
  }
  permute_KKT(&KKT_temp,p,Pnz,Anz,m,pcVar5,pcVar9,pcVar10);
  pcVar1 = KKT_temp;
  if (KKT_temp != (csc *)0x0) {
    lVar12 = pcVar2->n;
    QVar11 = QDLDL_etree(KKT_temp->n,KKT_temp->p,KKT_temp->i,p->iwork,p->Lnz,p->etree);
    if (QVar11 < 0) {
      __format = 
      "Error in KKT matrix LDL factorization when computing the elimination tree. A is not perfectly upper triangular"
      ;
    }
    else {
      pQVar6 = (QDLDL_int *)malloc(QVar11 << 3);
      pcVar2 = p->L;
      pcVar2->i = pQVar6;
      pQVar4 = (QDLDL_float *)malloc(QVar11 << 3);
      pcVar2->x = pQVar4;
      QVar11 = QDLDL_factor(pcVar1->n,pcVar1->p,pcVar1->i,pcVar1->x,pcVar2->p,pQVar6,pQVar4,p->D,
                            p->Dinv,p->Lnz,p->etree,p->bwork,p->iwork,p->fwork);
      if (QVar11 < 0) {
        __format = 
        "Error in KKT matrix LDL factorization when computing the nonzero elements. There are zeros in the diagonal matrix"
        ;
      }
      else {
        if (lVar12 <= QVar11) {
          if (local_50 == 0) {
            p->KKT = pcVar1;
          }
          else {
            csc_spfree(pcVar1);
          }
          return 0;
        }
        __format = 
        "Error in KKT matrix LDL factorization when computing the nonzero elements. The problem seems to be non-convex"
        ;
      }
    }
    printf("ERROR in %s: ","LDL_factor");
    printf(__format);
    putchar(10);
    csc_spfree(pcVar1);
    free_linsys_solver_qdldl(p);
    *local_58 = (qdldl_solver *)0x0;
    return 5;
  }
LAB_0010d91b:
  printf("ERROR in %s: ","init_linsys_solver_qdldl");
  printf("Error forming and permuting KKT matrix");
  putchar(10);
  free_linsys_solver_qdldl(p);
  *local_58 = (qdldl_solver *)0x0;
  return 4;
}

Assistant:

c_int init_linsys_solver_qdldl(qdldl_solver ** sp, const csc * P, const csc * A, c_float sigma, const c_float * rho_vec, c_int polish){

    // Define Variables
    csc * KKT_temp;     // Temporary KKT pointer
    c_int i;            // Loop counter
    c_int n_plus_m;     // Define n_plus_m dimension

    // Allocate private structure to store KKT factorization
    qdldl_solver *s;
    s = c_calloc(1, sizeof(qdldl_solver));
    *sp = s;

    // Size of KKT
    s->n = P->n;
    s->m = A->m;
    n_plus_m = s->n + s->m;

    // Sigma parameter
    s->sigma = sigma;

    // Polishing flag
    s->polish = polish;

    // Link Functions
    s->solve = &solve_linsys_qdldl;

#ifndef EMBEDDED
    s->free = &free_linsys_solver_qdldl;
#endif

#if EMBEDDED != 1
    s->update_matrices = &update_linsys_solver_matrices_qdldl;
    s->update_rho_vec = &update_linsys_solver_rho_vec_qdldl;
#endif

    // Assign type
    s->type = QDLDL_SOLVER;

    // Set number of threads to 1 (single threaded)
    s->nthreads = 1;

    // Sparse matrix L (lower triangular)
    // NB: We don not allocate L completely (CSC elements)
    //      L will be allocated during the factorization depending on the
    //      resulting number of elements.
    s->L = c_malloc(sizeof(csc));
    s->L->m = n_plus_m;
    s->L->n = n_plus_m;
    s->L->nz = -1;

    // Diagonal matrix stored as a vector D
    s->Dinv = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);
    s->D    = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Permutation vector P
    s->P    = (QDLDL_int *)c_malloc(sizeof(QDLDL_int) * n_plus_m);

    // Working vector
    s->bp   = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Solution vector
    s->sol  = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Parameter vector
    s->rho_inv_vec = (c_float *)c_malloc(sizeof(c_float) * s->m);

    // Elimination tree workspace
    s->etree = (QDLDL_int *)c_malloc(n_plus_m * sizeof(QDLDL_int));
    s->Lnz   = (QDLDL_int *)c_malloc(n_plus_m * sizeof(QDLDL_int));

    // Preallocate L matrix (Lx and Li are sparsity dependent)
    s->L->p = (c_int *)c_malloc((n_plus_m+1) * sizeof(QDLDL_int));

    // Lx and Li are sparsity dependent, so set them to
    // null initially so we don't try to free them prematurely
    s->L->i = OSQP_NULL;
    s->L->x = OSQP_NULL;

    // Preallocate workspace
    s->iwork = (QDLDL_int *)c_malloc(sizeof(QDLDL_int)*(3*n_plus_m));
    s->bwork = (QDLDL_bool *)c_malloc(sizeof(QDLDL_bool)*n_plus_m);
    s->fwork = (QDLDL_float *)c_malloc(sizeof(QDLDL_float)*n_plus_m);

    // Form and permute KKT matrix
    if (polish){ // Called from polish()
        // Use s->rho_inv_vec for storing param2 = vec(delta)
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = sigma;
        }

        KKT_temp = form_KKT(P, A, 0, sigma, s->rho_inv_vec, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);

        // Permute matrix
        if (KKT_temp)
            permute_KKT(&KKT_temp, s, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);
    }
    else { // Called from ADMM algorithm

        // Allocate vectors of indices
        s->PtoKKT = c_malloc((P->p[P->n]) * sizeof(c_int));
        s->AtoKKT = c_malloc((A->p[A->n]) * sizeof(c_int));
        s->rhotoKKT = c_malloc((A->m) * sizeof(c_int));

        // Use p->rho_inv_vec for storing param2 = rho_inv_vec
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = 1. / rho_vec[i];
        }

        KKT_temp = form_KKT(P, A, 0, sigma, s->rho_inv_vec,
                            s->PtoKKT, s->AtoKKT,
                            &(s->Pdiag_idx), &(s->Pdiag_n), s->rhotoKKT);

        // Permute matrix
        if (KKT_temp)
            permute_KKT(&KKT_temp, s, P->p[P->n], A->p[A->n], A->m, s->PtoKKT, s->AtoKKT, s->rhotoKKT);
    }

    // Check if matrix has been created
    if (!KKT_temp){
#ifdef PRINTING
        c_eprint("Error forming and permuting KKT matrix");
#endif
        free_linsys_solver_qdldl(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }

    // Factorize the KKT matrix
    if (LDL_factor(KKT_temp, s, P->n) < 0) {
        csc_spfree(KKT_temp);
        free_linsys_solver_qdldl(s);
        *sp = OSQP_NULL;
        return OSQP_NONCVX_ERROR;
    }

    if (polish){ // If KKT passed, assign it to KKT_temp
        // Polish, no need for KKT_temp
        csc_spfree(KKT_temp);
    }
    else { // If not embedded option 1 copy pointer to KKT_temp. Do not free it.
        s->KKT = KKT_temp;
    }


    // No error
    return 0;
}